

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double empirical_discrete_mean(int a,double *b,double *c)

{
  double dVar1;
  double local_30;
  double mean;
  int i;
  double *c_local;
  double *b_local;
  int a_local;
  
  local_30 = 0.0;
  for (mean._4_4_ = 0; mean._4_4_ < a; mean._4_4_ = mean._4_4_ + 1) {
    local_30 = b[mean._4_4_] * c[mean._4_4_] + local_30;
  }
  dVar1 = r8vec_sum(a,b);
  return local_30 / dVar1;
}

Assistant:

double empirical_discrete_mean ( int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_MEAN returns the mean of the Empirical Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_MEAN, the mean of the PDF.
//
{
  int i;
  double mean;

  mean = 0.0;
  for ( i = 0; i < a; i++ )
  {
    mean = mean + b[i] * c[i];
  }
  mean = mean / r8vec_sum ( a, b );

  return mean;
}